

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  deInt32 *pdVar1;
  deUint32 dVar2;
  pointer pSVar3;
  long lVar4;
  Resources *this;
  SharedPtrStateBase *pSVar5;
  CreateThread<vkt::api::(anonymous_namespace)::Device> *this_00;
  ulong uVar6;
  SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources> *this_01;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_d8;
  SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources> local_c8;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  local_b8;
  undefined8 local_a0;
  ThreadGroup threads;
  Environment env;
  
  local_a0 = param_3;
  dVar2 = getDefaultTestThreadCount();
  Environment::Environment(&env,context,1);
  uVar6 = (ulong)dVar2;
  if (dVar2 == 0) {
    pSVar3 = (pointer)0x0;
  }
  else {
    pSVar3 = (pointer)operator_new(uVar6 << 4);
  }
  local_b8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3 + uVar6;
  for (lVar4 = 0;
      local_b8.
      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&pSVar3->m_ptr + lVar4),
      uVar6 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    (local_b8.
     super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->m_ptr = (Resources *)0x0;
    (local_b8.
     super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)->m_state = (SharedPtrStateBase *)0x0;
  }
  local_b8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pSVar3;
  ThreadGroup::ThreadGroup(&threads);
  for (lVar4 = 0; uVar6 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    this = (Resources *)operator_new(0x1b8);
    Device::Resources::Resources(this,&env,(Parameters *)&local_a0);
    local_c8.m_state = (SharedPtrStateBase *)0x0;
    local_c8.m_ptr = this;
    pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar5->strongRefCount = 0;
    pSVar5->weakRefCount = 0;
    pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00bf7788;
    pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)this;
    pSVar5->strongRefCount = 1;
    pSVar5->weakRefCount = 1;
    local_c8.m_state = pSVar5;
    if (*(SharedPtrStateBase **)((long)&pSVar3->m_state + lVar4) != pSVar5) {
      this_01 = (SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources> *)
                ((long)&pSVar3->m_ptr + lVar4);
      de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>::release(this_01);
      this_01->m_ptr = this;
      this_01->m_state = pSVar5;
      LOCK();
      pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &this_01->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>::release(&local_c8);
    this_00 = (CreateThread<vkt::api::(anonymous_namespace)::Device> *)operator_new(0x88);
    pSVar3 = local_b8.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CreateThread<vkt::api::(anonymous_namespace)::Device>::CreateThread
              (this_00,&env,
               *(Resources **)
                ((long)&(local_b8.
                         super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar4),
               (Parameters *)&local_a0);
    local_d8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this_00;
    ThreadGroup::add(&threads,&local_d8);
    if ((CreateThread<vkt::api::(anonymous_namespace)::Device> *)
        local_d8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::Device> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_d8.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_d8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
  }
  ThreadGroup::run(__return_storage_ptr__,&threads);
  ThreadGroup::~ThreadGroup(&threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ::~vector(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}